

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecPat.c
# Opt level: O3

void Cec_ManPatComputePattern1_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vPat)

{
  int iVar1;
  uint uVar2;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pGVar4;
  ulong uVar3;
  
  pGVar4 = p->pObjs;
  if (pGVar4 <= pObj) {
    do {
      if (pGVar4 + p->nObjs <= pObj) break;
      iVar1 = (int)((long)pObj - (long)pGVar4 >> 2) * -0x55555555;
      if (p->nTravIdsAlloc <= iVar1) {
        __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x23c,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
      }
      if (p->pTravIds[iVar1] == p->nTravIds) {
        return;
      }
      p->pTravIds[iVar1] = p->nTravIds;
      uVar3 = *(ulong *)pObj;
      uVar2 = (uint)uVar3;
      if ((~uVar2 & 0x9fffffff) == 0) {
        Vec_IntPush(vPat,(uint)(uVar3 >> 0x1f) & 0x3ffffffe |
                         (uint)((uVar3 & 0x4000000000000000) == 0));
        return;
      }
      if (((int)uVar2 < 0) || ((uVar2 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecPat.c"
                      ,0xb4,
                      "void Cec_ManPatComputePattern1_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
      }
      pObj_00 = pObj + -(ulong)(uVar2 & 0x1fffffff);
      if ((uVar3 & 0x4000000000000000) == 0) {
        if ((((uint)(uVar3 >> 0x1d) & 7 ^ (uint)((ulong)*(undefined8 *)pObj_00 >> 0x3e)) & 1) != 0)
        {
          uVar2 = (uint)(uVar3 >> 0x20);
          uVar3 = (ulong)(uVar2 & 0x1fffffff);
          if (((uVar2 >> 0x1d ^ (uint)((ulong)*(undefined8 *)(pObj + -uVar3) >> 0x3e)) & 1) != 0) {
            __assert_fail("(Gia_ObjFanin0(pObj)->fMark1 ^ Gia_ObjFaninC0(pObj)) == 0 || (Gia_ObjFanin1(pObj)->fMark1 ^ Gia_ObjFaninC1(pObj)) == 0"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecPat.c"
                          ,0xbd,
                          "void Cec_ManPatComputePattern1_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)"
                         );
          }
          pObj_00 = pObj + -uVar3;
        }
      }
      else {
        Cec_ManPatComputePattern1_rec(p,pObj_00,vPat);
        pObj_00 = pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff);
        pGVar4 = p->pObjs;
      }
      pObj = pObj_00;
    } while (pGVar4 <= pObj_00);
  }
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Cec_ManPatComputePattern1_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vPat )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( Gia_ObjIsCi(pObj) )
    {
        Vec_IntPush( vPat, Abc_Var2Lit( Gia_ObjCioId(pObj), pObj->fMark1==0 ) );
        return;
    }
    assert( Gia_ObjIsAnd(pObj) );
    if ( pObj->fMark1 == 1 )
    {
        Cec_ManPatComputePattern1_rec( p, Gia_ObjFanin0(pObj), vPat );
        Cec_ManPatComputePattern1_rec( p, Gia_ObjFanin1(pObj), vPat );
    }
    else
    {
        assert( (Gia_ObjFanin0(pObj)->fMark1 ^ Gia_ObjFaninC0(pObj)) == 0 ||
                (Gia_ObjFanin1(pObj)->fMark1 ^ Gia_ObjFaninC1(pObj)) == 0 );
        if ( (Gia_ObjFanin0(pObj)->fMark1 ^ Gia_ObjFaninC0(pObj)) == 0 )
            Cec_ManPatComputePattern1_rec( p, Gia_ObjFanin0(pObj), vPat );
        else
            Cec_ManPatComputePattern1_rec( p, Gia_ObjFanin1(pObj), vPat );
    }
}